

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::insert
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  undefined4 uVar2;
  undefined4 uVar6;
  QArrayData *pQVar3;
  char *pcVar4;
  qsizetype qVar5;
  QXdgDBusImageStruct *pQVar7;
  long lVar8;
  qsizetype inserts;
  bool bVar9;
  
  uVar2 = t->width;
  uVar6 = t->height;
  pQVar3 = &((t->data).d.d)->super_QArrayData;
  pcVar4 = (t->data).d.ptr;
  qVar5 = (t->data).d.size;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar9 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
          super_QArrayDataPointer<QXdgDBusImageStruct>.size != 0;
  QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
            ((QArrayDataPointer<QXdgDBusImageStruct> *)this,(uint)(i == 0 && bVar9),n,
             (QXdgDBusImageStruct **)0x0,(QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
  if (i == 0 && bVar9) {
    if (n != 0) {
      pQVar7 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
               super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
      do {
        pQVar7[-1].width = uVar2;
        pQVar7[-1].height = uVar6;
        pQVar7[-1].data.d.d = (Data *)pQVar3;
        pQVar7[-1].data.d.ptr = pcVar4;
        pQVar7[-1].data.d.size = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        n = n + -1;
        pQVar7 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.ptr + -1;
        (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
        super_QArrayDataPointer<QXdgDBusImageStruct>.ptr = pQVar7;
        pqVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                  super_QArrayDataPointer<QXdgDBusImageStruct>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (n != 0);
    }
  }
  else {
    pQVar7 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.ptr + i;
    memmove(pQVar7 + n,pQVar7,
            ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.size - i) * 0x20);
    lVar8 = n;
    if (n != 0) {
      do {
        pQVar7->width = uVar2;
        pQVar7->height = uVar6;
        (pQVar7->data).d.d = (Data *)pQVar3;
        (pQVar7->data).d.ptr = pcVar4;
        (pQVar7->data).d.size = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar8 = lVar8 + -1;
        pQVar7 = pQVar7 + 1;
      } while (lVar8 != 0);
    }
    pqVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
              super_QArrayDataPointer<QXdgDBusImageStruct>.size;
    *pqVar1 = *pqVar1 + n;
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }